

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O3

DecodeStatus decodeBDLAddr12Len8Operand(MCInst *Inst,uint64_t Field,uint *Regs)

{
  DecodeStatus extraout_EAX;
  uint Reg;
  
  if ((Field >> 0xc & 0xf) == 0) {
    Reg = 0;
  }
  else {
    Reg = SystemZMC_GR64Regs[(uint)(Field >> 0xc) & 0xf];
  }
  MCOperand_CreateReg0(Inst,Reg);
  MCOperand_CreateImm0(Inst,(ulong)((uint)Field & 0xfff));
  MCOperand_CreateImm0(Inst,(Field >> 0x10) + 1);
  return extraout_EAX;
}

Assistant:

static DecodeStatus decodeBDLAddr12Len8Operand(MCInst *Inst, uint64_t Field,
		const unsigned *Regs)
{
	uint64_t Length = Field >> 16;
	uint64_t Base = (Field >> 12) & 0xf;
	uint64_t Disp = Field & 0xfff;
	//assert(Length < 256 && "Invalid BDLAddr12Len8");

	MCOperand_CreateReg0(Inst, Base == 0 ? 0 : Regs[Base]);
	MCOperand_CreateImm0(Inst, Disp);
	MCOperand_CreateImm0(Inst, Length + 1);

	return MCDisassembler_Success;
}